

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O2

bool tinyobj::exportFaceGroupToShape
               (shape_t *shape,
               map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *vertexCache,vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,
               vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               *faceGroup,vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,
               int material_id,string *name,bool clearCache,uint flags,string *err)

{
  mesh_t *positions;
  vector<float,_std::allocator<float>_> *this;
  vector<float,_std::allocator<float>_> *texcoords;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pfVar5;
  vector<float,_std::allocator<float>_> *in_positions_00;
  vector<float,_std::allocator<float>_> *in_normals_00;
  pointer pvVar6;
  ulong uVar7;
  ostream *poVar8;
  pointer pvVar9;
  ulong uVar10;
  ulong uVar11;
  size_t iIndices;
  long lVar12;
  bool bVar13;
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float3 fVar19;
  undefined3 in_stack_00000021;
  undefined4 in_stack_0000002c;
  uchar local_28d;
  uint v;
  vertex_index i2;
  uint v2;
  uint v1;
  vector<int,_std::allocator<int>_> *local_238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_230;
  vector<float,_std::allocator<float>_> *local_228;
  vector<float,_std::allocator<float>_> *local_220;
  vector<float,_std::allocator<float>_> *local_218;
  vertex_index i1;
  vertex_index i0;
  ostream local_1a8 [376];
  
  pvVar1 = (faceGroup->
           super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (faceGroup->
           super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 != pvVar2) {
    positions = &shape->mesh;
    this = &(shape->mesh).normals;
    texcoords = &(shape->mesh).texcoords;
    this_00 = &(shape->mesh).indices;
    local_230 = &(shape->mesh).num_vertices;
    local_238 = &(shape->mesh).material_ids;
    pvVar6 = pvVar2;
    pvVar9 = pvVar1;
    local_228 = in_positions;
    local_220 = in_normals;
    local_218 = in_texcoords;
    for (uVar11 = 0; uVar11 < (ulong)(((long)pvVar6 - (long)pvVar9) / 0x18); uVar11 = uVar11 + 1) {
      pvVar3 = pvVar9[uVar11].
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
               _M_impl.super__Vector_impl_data._M_start;
      i0.vn_idx = pvVar3->vn_idx;
      i0.v_idx = pvVar3->v_idx;
      i0.vt_idx = pvVar3->vt_idx;
      i1.v_idx = -1;
      i1.vt_idx = -1;
      i1.vn_idx = -1;
      pvVar3 = pvVar9[uVar11].
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
               _M_impl.super__Vector_impl_data._M_start;
      i2.vn_idx = pvVar3[1].vn_idx;
      i2.v_idx = pvVar3[1].v_idx;
      i2.vt_idx = pvVar3[1].vt_idx;
      uVar7 = ((long)pvVar9[uVar11].
                     super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)pvVar9[uVar11].
                    super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      if ((_clearCache & 1) == 0) {
        lVar12 = 0;
        uVar10 = uVar7;
        while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
          v = updateVertex(vertexCache,&positions->positions,this,texcoords,local_228,local_220,
                           local_218,
                           (vertex_index *)
                           ((long)&(pvVar9[uVar11].
                                    super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->v_idx + lVar12));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&v);
          lVar12 = lVar12 + 0xc;
        }
        v = CONCAT31(v._1_3_,(char)uVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (local_230,(uchar *)&v);
        std::vector<int,_std::allocator<int>_>::push_back(local_238,&material_id);
      }
      else {
        lVar12 = 0x18;
        for (uVar10 = 2; in_normals_00 = local_220, in_positions_00 = local_228, uVar10 < uVar7;
            uVar10 = uVar10 + 1) {
          i1.vn_idx = i2.vn_idx;
          i1.v_idx = i2.v_idx;
          i1.vt_idx = i2.vt_idx;
          pvVar3 = pvVar9[uVar11].
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          i2._0_8_ = *(undefined8 *)((long)&pvVar3->v_idx + lVar12);
          i2.vn_idx = *(int *)((long)&pvVar3->vn_idx + lVar12);
          v = updateVertex(vertexCache,&positions->positions,this,texcoords,local_228,local_220,
                           in_texcoords,&i0);
          v1 = updateVertex(vertexCache,&positions->positions,this,texcoords,in_positions_00,
                            in_normals_00,in_texcoords,&i1);
          v2 = updateVertex(vertexCache,&positions->positions,this,texcoords,in_positions_00,
                            in_normals_00,in_texcoords,&i2);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&v);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&v1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&v2);
          local_28d = '\x03';
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (local_230,&local_28d);
          std::vector<int,_std::allocator<int>_>::push_back(local_238,&material_id);
          lVar12 = lVar12 + 0xc;
        }
      }
      pvVar9 = (faceGroup->
               super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (faceGroup->
               super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (((_clearCache & 2) != 0) &&
       ((shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar11 = (long)(shape->mesh).indices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(shape->mesh).indices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar11 % 3 == 0) {
        std::vector<float,_std::allocator<float>_>::resize
                  (this,(long)(shape->mesh).positions.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(shape->mesh).positions.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2);
        for (uVar7 = 0; uVar7 < uVar11; uVar7 = uVar7 + 3) {
          puVar4 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pfVar5 = (positions->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(pfVar5 + puVar4[uVar7] * 3);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(pfVar5 + puVar4[uVar7 + 1] * 3);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(pfVar5 + puVar4[uVar7 + 2] * 3);
          auVar17 = vsubps_avx(auVar17,auVar16);
          i0.vn_idx = (int)(pfVar5[(ulong)(puVar4[uVar7 + 1] * 3) + 2] -
                           pfVar5[(ulong)(puVar4[uVar7] * 3) + 2]);
          i1.vn_idx = (int)(pfVar5[(ulong)(puVar4[uVar7 + 2] * 3) + 2] -
                           pfVar5[(ulong)(puVar4[uVar7] * 3) + 2]);
          auVar15 = (undefined1  [56])0x0;
          i0._0_8_ = vmovlps_avx(auVar17);
          auVar17 = vsubps_avx(auVar18,auVar16);
          i1._0_8_ = vmovlps_avx(auVar17);
          fVar19 = float3::crossproduct((float3 *)&i0,(float3 *)&i1);
          i2.vn_idx = fVar19.field_0._8_4_;
          auVar14._0_8_ = fVar19.field_0._0_8_;
          auVar14._8_56_ = auVar15;
          i2._0_8_ = vmovlps_avx(auVar14._0_16_);
          float3::normalize((float3 *)&i2);
          uVar10 = (ulong)((this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar7] * 3);
          pfVar5 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar5[uVar10 + 2] = (float)i2.vn_idx;
          pfVar5 = pfVar5 + uVar10;
          pfVar5[0] = (float)i2.v_idx;
          pfVar5[1] = (float)i2.vt_idx;
          pfVar5 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = (ulong)((this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar7 + 1] * 3);
          pfVar5[uVar10 + 2] = (float)i2.vn_idx;
          pfVar5 = pfVar5 + uVar10;
          pfVar5[0] = (float)i2.v_idx;
          pfVar5[1] = (float)i2.vt_idx;
          pfVar5 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = (ulong)((this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar7 + 2] * 3);
          pfVar5[uVar10 + 2] = (float)i2.vn_idx;
          pfVar5 = pfVar5 + uVar10;
          pfVar5[0] = (float)i2.v_idx;
          pfVar5[1] = (float)i2.vt_idx;
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&i0);
        poVar8 = std::operator<<(local_1a8,"WARN: The shape ");
        poVar8 = std::operator<<(poVar8,(string *)name);
        poVar8 = std::operator<<(poVar8,
                                 " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object."
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)CONCAT44(in_stack_0000002c,flags));
        std::__cxx11::string::~string((string *)&i1);
        std::__cxx11::stringstream::~stringstream((stringstream *)&i0);
      }
    }
    std::__cxx11::string::_M_assign((string *)shape);
    std::_Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::_Vector_impl_data::
    _M_swap_data((_Vector_impl_data *)&(shape->mesh).tags,(_Vector_impl_data *)tags);
    std::
    _Rb_tree<tinyobj::vertex_index,_std::pair<const_tinyobj::vertex_index,_unsigned_int>,_std::_Select1st<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
    ::clear(&vertexCache->_M_t);
  }
  return pvVar1 != pvVar2;
}

Assistant:

static bool exportFaceGroupToShape(
    shape_t &shape, std::map<vertex_index, unsigned int> vertexCache,
    const std::vector<float> &in_positions,
    const std::vector<float> &in_normals,
    const std::vector<float> &in_texcoords,
    const std::vector<std::vector<vertex_index> > &faceGroup,
    std::vector<tag_t> &tags, const int material_id, const std::string &name,
    bool clearCache, unsigned int flags, std::string& err ) {
  if (faceGroup.empty()) {
    return false;
  }

  bool triangulate( ( flags & triangulation ) == triangulation );
  bool normals_calculation( ( flags & calculate_normals ) == calculate_normals );

  // Flatten vertices and indices
  for (size_t i = 0; i < faceGroup.size(); i++) {
    const std::vector<vertex_index> &face = faceGroup[i];

    vertex_index i0 = face[0];
    vertex_index i1(-1);
    vertex_index i2 = face[1];

    size_t npolys = face.size();

    if (triangulate) {

      // Polygon -> triangle fan conversion
      for (size_t k = 2; k < npolys; k++) {
        i1 = i2;
        i2 = face[k];

        unsigned int v0 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i0);
        unsigned int v1 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i1);
        unsigned int v2 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i2);

        shape.mesh.indices.push_back(v0);
        shape.mesh.indices.push_back(v1);
        shape.mesh.indices.push_back(v2);

        shape.mesh.num_vertices.push_back(3);
        shape.mesh.material_ids.push_back(material_id);
      }
    } else {

      for (size_t k = 0; k < npolys; k++) {
        unsigned int v =
            updateVertex(vertexCache, shape.mesh.positions, shape.mesh.normals,
                         shape.mesh.texcoords, in_positions, in_normals,
                         in_texcoords, face[k]);

        shape.mesh.indices.push_back(v);
      }

      shape.mesh.num_vertices.push_back(static_cast<unsigned char>(npolys));
      shape.mesh.material_ids.push_back(material_id); // per face
    }
  }

  if (normals_calculation && shape.mesh.normals.empty()) {
	  const size_t nIndexs = shape.mesh.indices.size();
	  if (nIndexs % 3 == 0) {
		  shape.mesh.normals.resize(shape.mesh.positions.size());
		  for (size_t iIndices = 0; iIndices < nIndexs; iIndices += 3) {
			  float3 v1, v2, v3;
			  memcpy(&v1, &shape.mesh.positions[shape.mesh.indices[iIndices] * 3], sizeof(float3));
			  memcpy(&v2, &shape.mesh.positions[shape.mesh.indices[iIndices + 1] * 3], sizeof(float3));
			  memcpy(&v3, &shape.mesh.positions[shape.mesh.indices[iIndices + 2] * 3], sizeof(float3));

			  float3 v12(v1, v2);
			  float3 v13(v1, v3);

			  float3 normal = v12.crossproduct(v13);
			  normal.normalize();

			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 1] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 2] * 3], &normal, sizeof(float3));
		  }
	  } else {

		  std::stringstream ss;
		  ss << "WARN: The shape " << name << " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object." << std::endl;
		  err += ss.str();
	  }
  }

  shape.name = name;
  shape.mesh.tags.swap(tags);

  if (clearCache)
    vertexCache.clear();

  return true;
}